

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O1

bool stringToInt(string *line,size_t start,size_t end,int64_t *result)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  size_t sVar6;
  bool bVar7;
  
  pcVar1 = (line->_M_dataplus)._M_p;
  uVar5 = 10;
  bVar7 = true;
  if (pcVar1[start] == '0') {
    iVar2 = tolower((int)pcVar1[start + 1]);
    if (iVar2 == 0x62) {
      iVar2 = tolower((int)pcVar1[end - 1]);
      if (iVar2 == 0x68) goto LAB_0015e49a;
      uVar5 = 2;
    }
    else if (iVar2 == 0x6f) {
      uVar5 = 8;
    }
    else {
      if (iVar2 != 0x78) goto LAB_0015e49a;
      uVar5 = 0x10;
    }
    start = start + 2;
    bVar7 = false;
  }
LAB_0015e49a:
  if (bVar7) {
    sVar6 = end - 1;
    iVar2 = tolower((int)pcVar1[end - 1]);
    if (iVar2 == 0x68) {
      uVar5 = 0x10;
      end = sVar6;
    }
    else if (iVar2 == 0x62) {
      uVar5 = 2;
      end = sVar6;
    }
    else {
      if (iVar2 != 0x6f) {
        sVar6 = end;
      }
      uVar5 = (uint)(iVar2 != 0x6f) * 2 + 8;
      end = sVar6;
    }
  }
  *result = 0;
  bVar7 = end <= start;
  if (!bVar7) {
    iVar3 = tolower((int)pcVar1[start]);
    iVar2 = iVar3 + -0x57;
    if (iVar3 < 0x61) {
      iVar2 = iVar3 + -0x30;
    }
    if (iVar2 < (int)uVar5) {
      lVar4 = 0;
      do {
        start = start + 1;
        lVar4 = (long)iVar2 + lVar4 * (ulong)uVar5;
        *result = lVar4;
        if (end == start) break;
        iVar3 = tolower((int)pcVar1[start]);
        iVar2 = iVar3 + -0x57;
        if (iVar3 < 0x61) {
          iVar2 = iVar3 + -0x30;
        }
      } while (iVar2 < (int)uVar5);
      bVar7 = end <= start;
    }
  }
  return bVar7;
}

Assistant:

bool stringToInt(const std::string& line, size_t start, size_t end, int64_t& result)
{
	// find base of number
	int32_t base = 10;
	if (line[start] == '0')
	{
		if (tolower(line[start+1]) == 'x')
		{
			base = 16;
			start += 2;
		} else if (tolower(line[start+1]) == 'o')
		{
			base = 8;
			start += 2;
		} else if (tolower(line[start+1]) == 'b' && tolower(line[end-1]) != 'h')
		{
			base = 2;
			start += 2;
		}
	}

	if (base == 10)
	{
		if (tolower(line[end-1]) == 'h')
		{
			base = 16;
			end--;
		} else if (tolower(line[end-1]) == 'b')
		{
			base = 2;
			end--;
		} else if (tolower(line[end-1]) == 'o')
		{
			base = 8;
			end--;
		}
	}

	// convert number
	result = 0;
	while (start < end)
	{
		int c = tolower(line[start++]);

		int32_t value = c >= 'a' ? c-'a'+10 : c-'0';

		if (value >= base)
			return false;

		result = (result*base) + value;
	}

	return true;
}